

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poly.cpp
# Opt level: O1

void __thiscall
MT32Emu::Poly::reset(Poly *this,uint newKey,uint newVelocity,bool newSustain,Partial **newPartials)

{
  PolyState PVar1;
  bool bVar2;
  Synth *this_00;
  long lVar3;
  int i;
  
  if (this->state != POLY_Inactive) {
    this_00 = Part::getSynth(this->part);
    Synth::printDebug(this_00,"Resetting active poly. Active partial count: %i\n",
                      (ulong)this->activePartialCount);
    lVar3 = 4;
    do {
      if (this->partials[lVar3 + -4] != (Partial *)0x0) {
        bVar2 = Partial::isActive(this->partials[lVar3 + -4]);
        if (bVar2) {
          Partial::deactivate(this->partials[lVar3 + -4]);
          this->activePartialCount = this->activePartialCount - 1;
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
    PVar1 = this->state;
    if (PVar1 != POLY_Inactive) {
      this->state = POLY_Inactive;
      (*this->part->_vptr_Part[10])(this->part,(ulong)PVar1,3);
    }
  }
  this->key = newKey;
  this->velocity = newVelocity;
  this->sustain = newSustain;
  this->activePartialCount = 0;
  lVar3 = 0;
  do {
    this->partials[lVar3] = newPartials[lVar3];
    if (newPartials[lVar3] != (Partial *)0x0) {
      this->activePartialCount = this->activePartialCount + 1;
      PVar1 = this->state;
      if (PVar1 != POLY_Playing) {
        this->state = POLY_Playing;
        (*this->part->_vptr_Part[10])(this->part,(ulong)PVar1,0);
      }
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  return;
}

Assistant:

void Poly::reset(unsigned int newKey, unsigned int newVelocity, bool newSustain, Partial **newPartials) {
	if (isActive()) {
		// This should never happen
		part->getSynth()->printDebug("Resetting active poly. Active partial count: %i\n", activePartialCount);
		for (int i = 0; i < 4; i++) {
			if (partials[i] != NULL && partials[i]->isActive()) {
				partials[i]->deactivate();
				activePartialCount--;
			}
		}
		setState(POLY_Inactive);
	}

	key = newKey;
	velocity = newVelocity;
	sustain = newSustain;

	activePartialCount = 0;
	for (int i = 0; i < 4; i++) {
		partials[i] = newPartials[i];
		if (newPartials[i] != NULL) {
			activePartialCount++;
			setState(POLY_Playing);
		}
	}
}